

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(solitaire::graphics::TextureId,_unsigned_char)> * __thiscall
testing::internal::FunctionMocker<void_(solitaire::graphics::TextureId,_unsigned_char)>::With
          (MockSpec<void_(solitaire::graphics::TextureId,_unsigned_char)> *__return_storage_ptr__,
          FunctionMocker<void_(solitaire::graphics::TextureId,_unsigned_char)> *this,
          Matcher<solitaire::graphics::TextureId> *m,Matcher<unsigned_char> *m_1)

{
  tuple<testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<unsigned_char>_> local_58
  ;
  Matcher<unsigned_char> *local_28;
  Matcher<unsigned_char> *m_local_1;
  Matcher<solitaire::graphics::TextureId> *m_local;
  FunctionMocker<void_(solitaire::graphics::TextureId,_unsigned_char)> *this_local;
  
  local_28 = m_1;
  m_local_1 = (Matcher<unsigned_char> *)m;
  m_local = (Matcher<solitaire::graphics::TextureId> *)this;
  this_local = (FunctionMocker<void_(solitaire::graphics::TextureId,_unsigned_char)> *)
               __return_storage_ptr__;
  std::make_tuple<testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<unsigned_char>>
            (&local_58,m,m_1);
  MockSpec<void_(solitaire::graphics::TextureId,_unsigned_char)>::MockSpec
            (__return_storage_ptr__,this,&local_58);
  std::tuple<testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<unsigned_char>_>::
  ~tuple(&local_58);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }